

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalBlockStatement(Evaluator *this,BlockStmt *block,Env *env)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int *this_00;
  reference ppSVar4;
  Object *pOVar5;
  Types type;
  Stmt *stmt;
  iterator __end1;
  iterator __begin1;
  vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_> *__range1;
  string local_80;
  allocator<char> local_49;
  string local_48;
  Env *local_28;
  Env *scope;
  Env *env_local;
  BlockStmt *block_local;
  GCPtr<symbols::Object> *result;
  
  scope = env;
  env_local = (Env *)block;
  block_local = (BlockStmt *)this;
  local_28 = NewEnvironment(env);
  bVar2 = symbols::Env::is_recurseLimitExceeded(local_28);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"RecursionLimitExceeded: ",&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"recursion depth exceeded limit",
               (allocator<char> *)((long)&__range1 + 7));
    newError(this,&local_48,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    this_00 = &env_local->depth;
    __end1 = std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::begin
                       ((vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_> *)this_00);
    stmt = (Stmt *)std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::end
                             ((vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_> *)this_00);
    while (bVar2 = __gnu_cxx::
                   operator==<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
                             (&__end1,(__normal_iterator<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
                                       *)&stmt), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppSVar4 = __gnu_cxx::
                __normal_iterator<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
                ::operator*(&__end1);
      bVar2 = false;
      Eval(this,&(*ppSVar4)->super_Node,local_28);
      pOVar5 = GCPtr::operator_cast_to_Object_((GCPtr *)this);
      if (pOVar5 == (Object *)0x0) {
LAB_00112b0b:
        bVar1 = false;
      }
      else {
        pOVar5 = GCPtr<symbols::Object>::operator->((GCPtr<symbols::Object> *)this);
        iVar3 = (**pOVar5->_vptr_Object)();
        if ((iVar3 != 3) && (iVar3 != 4)) goto LAB_00112b0b;
        bVar2 = true;
        bVar1 = true;
      }
      if (!bVar2) {
        GCPtr<symbols::Object>::~GCPtr((GCPtr<symbols::Object> *)this);
      }
      if (bVar1) {
        return (GCPtr<symbols::Object>)(Object *)this;
      }
      __gnu_cxx::
      __normal_iterator<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>::
      operator++(&__end1);
    }
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_NULL);
  }
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalBlockStatement(BlockStmt* block, Env* env){
    auto scope = NewEnvironment(env);
    if(scope->is_recurseLimitExceeded())
        return newError("RecursionLimitExceeded: ", "recursion depth exceeded limit");

    for(auto stmt : block->Stmts){
        GCPtr<Object> result = Eval(stmt, scope);
        if(result != nullptr){
            auto type = result->type();
            if(type == Types::RETURNTYPE || type == Types::ERRORTYPE){
                return result;
            }
        }
    }
    return NATIVE_NULL;
}